

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O0

void __thiscall
Assimp::glTF2Exporter::GetMatTex
          (glTF2Exporter *this,aiMaterial *mat,Ref<glTF2::Texture> *texture,aiTextureType tt,
          uint slot)

{
  aiTexture **ppaVar1;
  aiTexture *paVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 data_00;
  bool bVar5;
  uint uVar6;
  aiReturn aVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  pointer ppVar11;
  element_type *peVar12;
  mapped_type *pmVar13;
  Texture *pTVar14;
  Image *pIVar15;
  Ref<glTF2::Texture> RVar16;
  Ref<glTF2::Image> RVar17;
  char *local_690;
  allocator<char> local_599;
  string local_598 [8];
  string mimeType;
  uint8_t *data;
  aiTexture *tex_1;
  allocator<char> local_541;
  string local_540;
  undefined1 local_520 [8];
  string imgId;
  allocator<char> local_4d9;
  string local_4d8;
  undefined1 local_4b8 [8];
  string texId;
  _Self local_478;
  _Self local_470;
  iterator it;
  allocator<char> local_451;
  undefined1 local_450 [8];
  string path;
  aiString tex;
  uint slot_local;
  aiTextureType tt_local;
  Ref<glTF2::Texture> *texture_local;
  aiMaterial *mat_local;
  glTF2Exporter *this_local;
  
  uVar6 = aiMaterial::GetTextureCount(mat,tt);
  if (uVar6 != 0) {
    aiString::aiString((aiString *)((long)&path.field_2 + 0xc));
    aVar7 = aiMaterial::Get(mat,"$tex.file",tt,slot,(aiString *)((long)&path.field_2 + 0xc));
    if (aVar7 == aiReturn_SUCCESS) {
      pcVar9 = aiString::C_Str((aiString *)((long)&path.field_2 + 0xc));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_450,pcVar9,&local_451);
      std::allocator<char>::~allocator(&local_451);
      lVar10 = std::__cxx11::string::size();
      if (lVar10 != 0) {
        local_470._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::find(&this->mTexturesByPath,(key_type *)local_450);
        local_478._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::end(&this->mTexturesByPath);
        bVar5 = std::operator!=(&local_470,&local_478);
        if (bVar5) {
          peVar12 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&this->mAsset);
          ppVar11 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                    ::operator->(&local_470);
          RVar16 = glTF2::LazyDict<glTF2::Texture>::Get(&peVar12->textures,ppVar11->second);
          texId.field_2._8_8_ = RVar16.vector;
          texture->vector =
               (vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *)texId.field_2._8_8_;
          texture->index = RVar16.index;
        }
        bVar5 = glTF2::Ref::operator_cast_to_bool((Ref *)texture);
        if (!bVar5) {
          peVar12 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&this->mAsset);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d8,"",&local_4d9);
          glTF2::Asset::FindUniqueID((string *)local_4b8,peVar12,&local_4d8,"texture");
          std::__cxx11::string::~string((string *)&local_4d8);
          std::allocator<char>::~allocator(&local_4d9);
          peVar12 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&this->mAsset);
          RVar16 = glTF2::LazyDict<glTF2::Texture>::Create(&peVar12->textures,(string *)local_4b8);
          imgId.field_2._8_8_ = RVar16.vector;
          texture->index = RVar16.index;
          texture->vector =
               (vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *)imgId.field_2._8_8_;
          uVar6 = glTF2::Ref<glTF2::Texture>::GetIndex(texture);
          pmVar13 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    ::operator[](&this->mTexturesByPath,(key_type *)local_450);
          *pmVar13 = uVar6;
          peVar12 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&this->mAsset);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_540,"",&local_541);
          glTF2::Asset::FindUniqueID((string *)local_520,peVar12,&local_540,"image");
          std::__cxx11::string::~string((string *)&local_540);
          std::allocator<char>::~allocator(&local_541);
          peVar12 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&this->mAsset);
          RVar17 = glTF2::LazyDict<glTF2::Image>::Create(&peVar12->images,(string *)local_520);
          pTVar14 = glTF2::Ref<glTF2::Texture>::operator->(texture);
          (pTVar14->source).index = RVar17.index;
          (pTVar14->source).vector = RVar17.vector;
          pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)local_450);
          if (*pcVar9 == '*') {
            ppaVar1 = this->mScene->mTextures;
            pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)local_450);
            iVar8 = atoi(pcVar9);
            paVar2 = ppaVar1[iVar8];
            mimeType.field_2._8_8_ = paVar2->pcData;
            pTVar14 = glTF2::Ref<glTF2::Texture>::operator->(texture);
            pIVar15 = glTF2::Ref<glTF2::Image>::operator->(&pTVar14->source);
            data_00 = mimeType.field_2._8_8_;
            uVar6 = paVar2->mWidth;
            peVar12 = std::
                      __shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator*((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->mAsset);
            glTF2::Image::SetData(pIVar15,(uint8_t *)data_00,(ulong)uVar6,peVar12);
            if (paVar2->achFormatHint[0] != '\0') {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>(local_598,"image/",&local_599);
              std::allocator<char>::~allocator(&local_599);
              iVar8 = memcmp(paVar2->achFormatHint,"jpg",3);
              if (iVar8 == 0) {
                local_690 = "jpeg";
              }
              else {
                local_690 = paVar2->achFormatHint;
              }
              std::__cxx11::string::operator+=(local_598,local_690);
              pTVar14 = glTF2::Ref<glTF2::Texture>::operator->(texture);
              pIVar15 = glTF2::Ref<glTF2::Image>::operator->(&pTVar14->source);
              std::__cxx11::string::operator=((string *)&pIVar15->mimeType,local_598);
              std::__cxx11::string::~string(local_598);
            }
          }
          else {
            pTVar14 = glTF2::Ref<glTF2::Texture>::operator->(texture);
            pIVar15 = glTF2::Ref<glTF2::Image>::operator->(&pTVar14->source);
            std::__cxx11::string::operator=((string *)&pIVar15->uri,(string *)local_450);
          }
          uVar3 = texture->vector;
          uVar4 = texture->index;
          RVar16.index = uVar4;
          RVar16.vector = (vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *)uVar3;
          RVar16._12_4_ = 0;
          GetTexSampler(this,mat,RVar16,tt,slot);
          std::__cxx11::string::~string((string *)local_520);
          std::__cxx11::string::~string((string *)local_4b8);
        }
      }
      std::__cxx11::string::~string((string *)local_450);
    }
  }
  return;
}

Assistant:

void glTF2Exporter::GetMatTex(const aiMaterial* mat, Ref<Texture>& texture, aiTextureType tt, unsigned int slot = 0)
{

    if (mat->GetTextureCount(tt) > 0) {
        aiString tex;

        if (mat->Get(AI_MATKEY_TEXTURE(tt, slot), tex) == AI_SUCCESS) {
            std::string path = tex.C_Str();

            if (path.size() > 0) {
                std::map<std::string, unsigned int>::iterator it = mTexturesByPath.find(path);
                if (it != mTexturesByPath.end()) {
                    texture = mAsset->textures.Get(it->second);
                }

                if (!texture) {
                    std::string texId = mAsset->FindUniqueID("", "texture");
                    texture = mAsset->textures.Create(texId);
                    mTexturesByPath[path] = texture.GetIndex();

                    std::string imgId = mAsset->FindUniqueID("", "image");
                    texture->source = mAsset->images.Create(imgId);

                    if (path[0] == '*') { // embedded
                        aiTexture* tex = mScene->mTextures[atoi(&path[1])];

                        uint8_t* data = reinterpret_cast<uint8_t*>(tex->pcData);
                        texture->source->SetData(data, tex->mWidth, *mAsset);

                        if (tex->achFormatHint[0]) {
                            std::string mimeType = "image/";
                            mimeType += (memcmp(tex->achFormatHint, "jpg", 3) == 0) ? "jpeg" : tex->achFormatHint;
                            texture->source->mimeType = mimeType;
                        }
                    }
                    else {
                        texture->source->uri = path;
                    }

                    GetTexSampler(mat, texture, tt, slot);
                }
            }
        }
    }
}